

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Cube::setupRightFace(Cube *this)

{
  float local_58;
  float local_54;
  float rightFace [18];
  Cube *this_local;
  
  local_58 = this->x + this->l;
  local_54 = this->y;
  rightFace[0] = this->z + this->b;
  rightFace[1] = this->x + this->l;
  rightFace[2] = this->y;
  rightFace[3] = this->z;
  rightFace[4] = this->x + this->l;
  rightFace[5] = this->y + this->h;
  rightFace[6] = this->z;
  rightFace[7] = this->x + this->l;
  rightFace[8] = this->y;
  rightFace[9] = this->z + this->b;
  rightFace[10] = this->x + this->l;
  rightFace[0xb] = this->y + this->h;
  rightFace[0xc] = this->z;
  rightFace[0xd] = this->x + this->l;
  rightFace[0xe] = this->y + this->h;
  rightFace[0xf] = this->z + this->b;
  rightFace._64_8_ = this;
  arrayCopy(this,&local_58,this->positionData,0x36);
  return;
}

Assistant:

void setupRightFace() {
        float rightFace[]={

            x+l,y,z+b,
            x+l,y,z,
            x+l,y+h,z,
            x+l,y,z+b,
            x+l,y+h,z,
            x+l,y+h,z+b
        };

        arrayCopy(rightFace,positionData,54);
    }